

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_macro5.c
# Opt level: O0

int dwarf_get_macro_import
              (Dwarf_Macro_Context macro_context,Dwarf_Unsigned op_number,
              Dwarf_Unsigned *target_offset,Dwarf_Error *error)

{
  Dwarf_Byte_Ptr readend;
  Dwarf_Unsigned _ltmp;
  Dwarf_Byte_Ptr endptr;
  Dwarf_Byte_Ptr startptr;
  Dwarf_Small *mdata;
  Dwarf_Macro_Operator_s *curop;
  Dwarf_Debug pDStack_40;
  uint macop;
  Dwarf_Debug dbg;
  Dwarf_Unsigned supoffset;
  Dwarf_Error *error_local;
  Dwarf_Unsigned *target_offset_local;
  Dwarf_Unsigned op_number_local;
  Dwarf_Macro_Context macro_context_local;
  
  dbg = (Dwarf_Debug)0x0;
  pDStack_40 = (Dwarf_Debug)0x0;
  curop._4_4_ = 0;
  mdata = (Dwarf_Small *)0x0;
  startptr = (Dwarf_Byte_Ptr)0x0;
  endptr = (Dwarf_Byte_Ptr)0x0;
  _ltmp = 0;
  supoffset = (Dwarf_Unsigned)error;
  error_local = (Dwarf_Error *)target_offset;
  target_offset_local = (Dwarf_Unsigned *)op_number;
  op_number_local = (Dwarf_Unsigned)macro_context;
  if ((macro_context == (Dwarf_Macro_Context)0x0) || (macro_context->mc_sentinel != 0xada)) {
    if (macro_context != (Dwarf_Macro_Context)0x0) {
      pDStack_40 = macro_context->mc_dbg;
    }
    _dwarf_error_string(pDStack_40,error,0x142,
                        "DW_DLE_BAD_MACRO_HEADER_POINTER  NULL header or corrupt header");
    macro_context_local._4_4_ = 1;
  }
  else {
    endptr = macro_context->mc_macro_header;
    _ltmp = (Dwarf_Unsigned)(endptr + macro_context->mc_total_length);
    pDStack_40 = macro_context->mc_dbg;
    if (op_number < macro_context->mc_macro_ops_count) {
      mdata = &macro_context->mc_ops[op_number].mo_opcode;
      curop._4_4_ = (uint)((Dwarf_Macro_Operator_s *)mdata)->mo_opcode;
      startptr = ((Dwarf_Macro_Operator_s *)mdata)->mo_data;
      if ((curop._4_4_ == 7) || (curop._4_4_ == 10)) {
        readend = (Dwarf_Byte_Ptr)0x0;
        if (startptr + (int)(uint)macro_context->mc_offset_size < startptr) {
          _dwarf_error_string(pDStack_40,error,0x14b,
                              "DW_DLE_READ_LITTLEENDIAN_ERROR Read starts past the end of section");
          macro_context_local._4_4_ = 1;
        }
        else if (_ltmp < startptr + (int)(uint)macro_context->mc_offset_size) {
          _dwarf_error_string(pDStack_40,error,0x14b,
                              "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section"
                             );
          macro_context_local._4_4_ = 1;
        }
        else {
          (*pDStack_40->de_copy_word)
                    (&readend,startptr,(unsigned_long)macro_context->mc_offset_size);
          *error_local = (Dwarf_Error)readend;
          macro_context_local._4_4_ = 0;
        }
      }
      else {
        macro_context_local._4_4_ = -1;
      }
    }
    else {
      _dwarf_error(pDStack_40,error,0x143);
      macro_context_local._4_4_ = 1;
    }
  }
  return macro_context_local._4_4_;
}

Assistant:

int
dwarf_get_macro_import(Dwarf_Macro_Context macro_context,
    Dwarf_Unsigned   op_number,
    Dwarf_Unsigned * target_offset,
    Dwarf_Error *error)
{
    Dwarf_Unsigned supoffset = 0;
    Dwarf_Debug dbg = 0;
    unsigned macop = 0;
    struct Dwarf_Macro_Operator_s *curop = 0;
    Dwarf_Small *mdata = 0;
    Dwarf_Byte_Ptr startptr =  0;
    Dwarf_Byte_Ptr endptr =  0;

    CHECKNULLCONTEXT(macro_context,dbg,error);
    startptr = macro_context->mc_macro_header;
    endptr = startptr + macro_context->mc_total_length;
    dbg = macro_context->mc_dbg;
    if (op_number >= macro_context->mc_macro_ops_count) {
        _dwarf_error(dbg, error,DW_DLE_BAD_MACRO_INDEX);
        return DW_DLV_ERROR;
    }
    curop = macro_context->mc_ops + op_number;
    macop = curop->mo_opcode;
    mdata = curop->mo_data;
    if (macop != DW_MACRO_import && macop != DW_MACRO_import_sup) {
        return DW_DLV_NO_ENTRY;
    }
    READ_UNALIGNED_CK(dbg,supoffset,Dwarf_Unsigned,
        mdata,macro_context->mc_offset_size,
        error,endptr);
    *target_offset = supoffset;
    return DW_DLV_OK;
}